

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_raster.cpp
# Opt level: O0

QImage * __thiscall QRasterPlatformPixmap::toImage(QRasterPlatformPixmap *this)

{
  long lVar1;
  bool bVar2;
  DataPtr *ppQVar3;
  QPaintDevice *pQVar4;
  QRect *this_00;
  long in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  QImageData *data;
  QImage *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = QImage::isNull((QImage *)(in_RSI + 0x30));
  if (!bVar2) {
    ppQVar3 = QImage::data_ptr((QImage *)(in_RSI + 0x30));
    if ((((*ppQVar3)->paintEngine != (QPaintEngine *)0x0) &&
        (bVar2 = QPaintEngine::isActive((*ppQVar3)->paintEngine), bVar2)) &&
       (pQVar4 = QPaintEngine::paintDevice((QPaintEngine *)0x3268e5),
       pQVar4 == (QPaintDevice *)(in_RSI + 0x30))) {
      this_00 = (QRect *)(in_RSI + 0x30);
      QRect::QRect(this_00);
      QImage::copy(in_RDI,this_00);
      goto LAB_00326936;
    }
  }
  QImage::QImage(this_01,in_RDI);
LAB_00326936:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QImage QRasterPlatformPixmap::toImage() const
{
    if (!image.isNull()) {
        QImageData *data = const_cast<QImage &>(image).data_ptr();
        if (data->paintEngine && data->paintEngine->isActive()
            && data->paintEngine->paintDevice() == &image)
        {
            return image.copy();
        }
    }

    return image;
}